

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.h
# Opt level: O0

bool __thiscall
wasm::analysis::Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_>::join
          (Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this,Element *joinee,
          Element *joiner)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference joinee_00;
  reference joiner_00;
  bool bVar4;
  bool local_ca;
  undefined1 local_98 [16];
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
  local_88;
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
  joineeEnd;
  const_reverse_iterator joinerIt;
  reverse_iterator joineeIt;
  __normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_> local_58;
  const_iterator local_50;
  __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
  local_48;
  __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
  local_40;
  __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
  extraEnd;
  const_iterator extraBegin;
  size_t extraSize;
  bool result;
  Element *joiner_local;
  Element *joinee_local;
  Stack<wasm::analysis::Inverted<wasm::analysis::ValType>_> *this_local;
  
  sVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(joiner);
  sVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(joinee);
  bVar4 = sVar3 < sVar2;
  if (bVar4) {
    sVar2 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(joiner);
    sVar3 = std::vector<wasm::Type,_std::allocator<wasm::Type>_>::size(joinee);
    extraEnd._M_current =
         (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(joiner);
    local_48._M_current =
         (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(joiner);
    local_40 = __gnu_cxx::
               __normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>
               ::operator+(&local_48,sVar2 - sVar3);
    local_58._M_current =
         (Type *)std::vector<wasm::Type,_std::allocator<wasm::Type>_>::begin(joinee);
    __gnu_cxx::
    __normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>::
    __normal_iterator<wasm::Type*>
              ((__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>
                *)&local_50,&local_58);
    std::vector<wasm::Type,std::allocator<wasm::Type>>::
    insert<__gnu_cxx::__normal_iterator<wasm::Type_const*,std::vector<wasm::Type,std::allocator<wasm::Type>>>,void>
              ((vector<wasm::Type,std::allocator<wasm::Type>> *)joinee,local_50,extraEnd,local_40);
  }
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rbegin
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&joinerIt);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rbegin
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&joineeEnd);
  std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rend
            ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)(local_98 + 8));
  std::
  reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
  ::operator-(&local_88,(difference_type)(local_98 + 8));
  while( true ) {
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                             *)&joinerIt,&local_88);
    local_ca = false;
    if (bVar1) {
      std::vector<wasm::Type,_std::allocator<wasm::Type>_>::rend
                ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_98);
      local_ca = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                                  *)&joineeEnd,
                                 (reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                                  *)local_98);
    }
    if (local_ca == false) break;
    joinee_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                             *)&joinerIt);
    joiner_00 = std::
                reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                ::operator*((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                             *)&joineeEnd);
    bVar1 = Inverted<wasm::analysis::ValType>::join<wasm::Type>
                      ((Inverted<wasm::analysis::ValType> *)this,joinee_00,joiner_00);
    bVar4 = bVar4 != false || bVar1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                  *)&joinerIt);
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_wasm::Type_*,_std::vector<wasm::Type,_std::allocator<wasm::Type>_>_>_>
                  *)&joineeEnd);
  }
  return bVar4;
}

Assistant:

bool join(Element& joinee, const Element& joiner) const noexcept {
    // If joiner is deeper than joinee, prepend those extra elements to joinee
    // first. They don't need to be explicitly joined with anything because they
    // would be joined with bottom, which wouldn't change them.
    bool result = false;
    size_t extraSize = 0;
    if (joiner.size() > joinee.size()) {
      extraSize = joiner.size() - joinee.size();
      auto extraBegin = joiner.begin();
      auto extraEnd = joiner.begin() + extraSize;
      joinee.insert(joinee.begin(), extraBegin, extraEnd);
      result = true;
    }
    // Join all the elements present in both materialized stacks, starting from
    // the end so the stack tops match up. Stop the iteration when we've
    // processed all of joinee, excluding any extra elements from joiner we just
    // prepended to it, or when we've processed all of joiner.
    auto joineeIt = joinee.rbegin();
    auto joinerIt = joiner.rbegin();
    auto joineeEnd = joinee.rend() - extraSize;
    for (; joineeIt != joineeEnd && joinerIt != joiner.rend();
         ++joineeIt, ++joinerIt) {
      result |= lattice.join(*joineeIt, *joinerIt);
    }
    return result;
  }